

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::CreateTempFile
          (CommandLineInterfaceTester *this,string_view name,string_view contents)

{
  string_view pc;
  bool bVar1;
  char *pcVar2;
  LogMessage *pLVar3;
  AlphaNum *c;
  size_type in_R9;
  string_view s;
  FixedMapping replacements;
  Status *local_438;
  Status *local_3f0;
  LogMessage local_380;
  Voidify local_369;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_368;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_348;
  undefined8 local_340;
  lts_20250127 *local_338;
  size_t sStack_330;
  string local_320;
  string_view local_300;
  Status local_2f0;
  undefined1 local_2e8 [8];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo_1;
  AlphaNum local_2c0;
  AlphaNum local_290;
  AlphaNum local_260;
  undefined1 local_230 [8];
  string full_name;
  Voidify local_1f9;
  size_t local_1f8;
  size_t sStack_1f0;
  AlphaNum local_1e0;
  AlphaNum local_1b0;
  AlphaNum local_180;
  string local_150;
  Status local_130;
  undefined1 local_128 [8];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  AlphaNum local_f8;
  AlphaNum local_c8;
  AlphaNum local_98;
  string local_68;
  undefined1 auStack_48 [8];
  string_view dir;
  size_type slash_pos;
  CommandLineInterfaceTester *this_local;
  string_view contents_local;
  string_view name_local;
  
  c = (AlphaNum *)contents._M_str;
  contents_local._M_str = (char *)name._M_len;
  contents_local._M_len = (size_t)c;
  dir._M_str = (char *)std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                                 ((basic_string_view<char,_std::char_traits<char>_> *)
                                  &contents_local._M_str,'/',0xffffffffffffffff);
  if (dir._M_str != (char *)0xffffffffffffffff) {
    _auStack_48 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             &contents_local._M_str,0,(size_type)dir._M_str);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_98,&this->temp_directory_);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_c8,"/");
    absl::lts_20250127::AlphaNum::AlphaNum(&local_f8,_auStack_48);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_68,(lts_20250127 *)&local_98,&local_c8,&local_f8,c)
    ;
    bVar1 = anon_unknown_3::FileExists(&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
      pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
                ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)local_128);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>
                (&local_180,&this->temp_directory_);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1b0,"/");
      local_1f8 = (size_t)auStack_48;
      sStack_1f0 = dir._M_len;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_1e0,_auStack_48);
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_150,(lts_20250127 *)&local_180,&local_1b0,&local_1e0,c);
      File::RecursivelyCreateDir((File *)&local_130,&local_150,0x1ff);
      local_128 = (undefined1  [8])absl::lts_20250127::log_internal::AsStatus(&local_130);
      bVar1 = absl::lts_20250127::Status::ok((Status *)local_128);
      if (bVar1) {
        local_3f0 = (Status *)0x0;
      }
      else {
        local_3f0 = (Status *)
                    absl::lts_20250127::status_internal::MakeCheckFailString
                              ((Nonnull<const_absl::Status_*>)local_128,
                               "File::RecursivelyCreateDir( absl::StrCat(temp_directory_, \"/\", dir), 0777) is OK"
                              );
      }
      absl_log_internal_check_ok_goo.first = local_3f0;
      bVar1 = absl::lts_20250127::Status::ok((Status *)local_128);
      absl::lts_20250127::Status::~Status(&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pcVar2 = absl::lts_20250127::implicit_cast<char_const*>
                           ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
        pLVar3 = (LogMessage *)((long)&full_name.field_2 + 8);
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)pLVar3,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
                   ,99,pcVar2);
        pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(pLVar3);
        absl::lts_20250127::log_internal::Voidify::operator&&(&local_1f9,pLVar3);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)((long)&full_name.field_2 + 8));
      }
    }
  }
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_260,&this->temp_directory_);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_290,"/");
  absl_log_internal_check_ok_goo_1.second = contents_local._M_str;
  pc._M_str = name._M_str;
  pc._M_len = (size_t)contents_local._M_str;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_2c0,pc);
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_230,(lts_20250127 *)&local_260,&local_290,&local_2c0,c);
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)local_2e8);
  sStack_330 = contents_local._M_len;
  local_338 = (lts_20250127 *)contents._M_len;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  pair<const_char_(&)[8],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_368,(char (*) [8])"$tmpdir",&this->temp_directory_);
  local_348 = &local_368;
  local_340 = 1;
  s._M_str = (char *)local_348;
  s._M_len = sStack_330;
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_320,local_338,s,replacements);
  local_300 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_320);
  File::SetContents((File *)&local_2f0,(string *)local_230,local_300,true);
  local_2e8 = (undefined1  [8])absl::lts_20250127::log_internal::AsStatus(&local_2f0);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_2e8);
  if (bVar1) {
    local_438 = (Status *)0x0;
  }
  else {
    local_438 = (Status *)
                absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_2e8,
                           "File::SetContents( full_name, absl::StrReplaceAll(contents, {{\"$tmpdir\", temp_directory_}}), true) is OK"
                          );
  }
  absl_log_internal_check_ok_goo_1.first = local_438;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_2e8);
  absl::lts_20250127::Status::~Status(&local_2f0);
  std::__cxx11::string::~string((string *)&local_320);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>
                       ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo_1.first);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
               ,0x6b,pcVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_380);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_369,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_380);
  }
  std::__cxx11::string::~string((string *)local_230);
  return;
}

Assistant:

void CommandLineInterfaceTester::CreateTempFile(absl::string_view name,
                                                absl::string_view contents) {
  // Create parent directory, if necessary.
  std::string::size_type slash_pos = name.find_last_of('/');
  if (slash_pos != std::string::npos) {
    absl::string_view dir = name.substr(0, slash_pos);
    if (!FileExists(absl::StrCat(temp_directory_, "/", dir))) {
      ABSL_CHECK_OK(File::RecursivelyCreateDir(
          absl::StrCat(temp_directory_, "/", dir), 0777));
    }
  }

  // Write file.
  std::string full_name = absl::StrCat(temp_directory_, "/", name);
  ABSL_CHECK_OK(File::SetContents(
      full_name, absl::StrReplaceAll(contents, {{"$tmpdir", temp_directory_}}),
      true));
}